

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogSetSecretStorage::DropSecretByName
          (CatalogSetSecretStorage *this,string *name,OnEntryNotFound on_entry_not_found,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  uint uVar1;
  pointer pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  InvalidInputException *this_00;
  undefined7 in_register_00000011;
  char *pcVar4;
  allocator local_145;
  uint local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string storage_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string persist_string;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  local_144 = (uint)CONCAT71(in_register_00000011,on_entry_not_found);
  pCVar2 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (&this->secrets);
  GetTransactionOrDefault(&local_58,this,transaction);
  uVar1 = local_144;
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  oVar3 = CatalogSet::GetEntry(pCVar2,transaction_00,name);
  if ((uVar1 == 0) && (oVar3.ptr == (CatalogEntry *)0x0)) {
    pcVar4 = "temporary";
    if ((this->super_SecretStorage).persistent != false) {
      pcVar4 = "persistent";
    }
    ::std::__cxx11::string::string((string *)&persist_string,pcVar4,(allocator *)&storage_string);
    if ((this->super_SecretStorage).persistent == true) {
      ::std::operator+(&local_140," in secret storage \'",&(this->super_SecretStorage).storage_name)
      ;
      ::std::operator+(&storage_string,&local_140,"\'");
      ::std::__cxx11::string::~string((string *)&local_140);
    }
    else {
      ::std::__cxx11::string::string
                ((string *)&storage_string,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_140);
    }
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_140,"Failed to remove non-existent %s secret \'%s\'%s",&local_145);
    ::std::__cxx11::string::string((string *)&local_c0,(string *)&persist_string);
    ::std::__cxx11::string::string((string *)&local_e0,(string *)name);
    ::std::__cxx11::string::string((string *)&local_100,(string *)&storage_string);
    InvalidInputException::
    InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (this_00,&local_140,&local_c0,&local_e0,&local_100);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar2 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (&this->secrets);
  GetTransactionOrDefault(&local_80,this,transaction);
  transaction_01.context.ptr = local_80.context.ptr;
  transaction_01.db.ptr = local_80.db.ptr;
  transaction_01.transaction.ptr = local_80.transaction.ptr;
  transaction_01.transaction_id = local_80.transaction_id;
  transaction_01.start_time = local_80.start_time;
  CatalogSet::DropEntry(pCVar2,transaction_01,name,true,true);
  (*(this->super_SecretStorage)._vptr_SecretStorage[0xb])(this,name,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

void CatalogSetSecretStorage::DropSecretByName(const string &name, OnEntryNotFound on_entry_not_found,
                                               optional_ptr<CatalogTransaction> transaction) {
	auto entry = secrets->GetEntry(GetTransactionOrDefault(transaction), name);
	if (!entry && on_entry_not_found == OnEntryNotFound::THROW_EXCEPTION) {
		string persist_string = persistent ? "persistent" : "temporary";
		string storage_string = persistent ? " in secret storage '" + storage_name + "'" : "";
		throw InvalidInputException("Failed to remove non-existent %s secret '%s'%s", persist_string, name,
		                            storage_string);
	}

	secrets->DropEntry(GetTransactionOrDefault(transaction), name, true, true);
	RemoveSecret(name, on_entry_not_found);
}